

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::IteratorIndexMethod::checkArguments
          (IteratorIndexMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  size_type sVar3;
  reference ppEVar4;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Type *indexType;
  IteratorSymbol *iterator;
  Compilation *comp;
  Type *pTVar5;
  Diagnostic *this_01;
  undefined4 in_stack_ffffffffffffff98;
  Expression *in_stack_ffffffffffffffa0;
  ASTContext *in_stack_ffffffffffffffa8;
  SystemSubroutine *this_02;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x93418f);
  pTVar5 = (Type *)0x0;
  this_01 = (Diagnostic *)0x1;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  this_02 = in_RCX;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,in_RDI,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x934209
                      );
    if (1 < sVar3) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x93422a)
      ;
      bVar1 = Type::isIntegral((Type *)this_01);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        pTVar5 = SystemSubroutine::badArg
                           (in_RCX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        return pTVar5;
      }
    }
    ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RDX,0);
    Expression::as<slang::ast::NamedValueExpression>(*ppEVar4);
    Symbol::as<slang::ast::IteratorSymbol>((Symbol *)0x93428d);
    bVar1 = Type::isAssociativeArray((Type *)0x9342a3);
    if (bVar1) {
      pTVar2 = Type::getAssociativeIndexType(pTVar5);
      if (pTVar2 == (Type *)0x0) {
        sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff98;
        sourceRange.startLoc = in_R8;
        sourceRange.endLoc._4_4_ = 0x3000b;
        ASTContext::addDiag((ASTContext *)this_02,(DiagCode)0x0,sourceRange);
        Diagnostic::operator<<(this_01,(string *)pTVar5);
        pTVar2 = Compilation::getErrorType(this_00);
      }
    }
    else {
      pTVar2 = Compilation::getIntType(this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() > 1 && !args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        auto& iterator = args[0]->as<NamedValueExpression>().symbol.as<IteratorSymbol>();
        if (iterator.arrayType.isAssociativeArray()) {
            auto indexType = iterator.arrayType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
                return comp.getErrorType();
            }
            return *indexType;
        }

        return comp.getIntType();
    }